

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_buildBlockEntropyStats
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,
                 ZSTD_entropyCTablesMetadata_t *entropyMetadata,void *workspace,size_t wkspSize)

{
  BYTE *source;
  BYTE *pBVar1;
  int iVar2;
  uint maxNbBits;
  size_t err_code_2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  HUF_repeat HVar8;
  size_t err_code;
  ulong sourceSize;
  symbolEncodingType_e sVar9;
  undefined8 uVar10;
  ZSTD_symbolEncodingTypeStats_t local_58;
  ZSTD_CCtx_params *local_38;
  
  source = seqStorePtr->litStart;
  pBVar1 = seqStorePtr->lit;
  local_38 = cctxParams;
  iVar2 = ZSTD_disableLiteralsCompression(cctxParams);
  local_58.LLtype = 0xff;
  HVar8 = (prevEntropy->huf).repeatMode;
  memcpy(nextEntropy,prevEntropy,0x404);
  sVar9 = set_basic;
  if (iVar2 == 0) {
    sourceSize = (long)pBVar1 - (long)source;
    uVar6 = 0x3f;
    if ((prevEntropy->huf).repeatMode == HUF_repeat_valid) {
      uVar6 = 6;
    }
    if (sourceSize <= uVar6) goto LAB_001a2419;
    sVar3 = HIST_count_wksp((uint *)workspace,&local_58.LLtype,source,sourceSize,workspace,wkspSize)
    ;
    if (0xffffffffffffff88 < sVar3) {
LAB_001a2661:
      (entropyMetadata->hufMetadata).hufDesSize = sVar3;
      return sVar3;
    }
    if (sVar3 == sourceSize) {
      sVar9 = set_rle;
      goto LAB_001a2419;
    }
    if (sVar3 <= (sourceSize >> 7) + 4) goto LAB_001a2419;
    if (HVar8 == HUF_repeat_check) {
      iVar2 = HUF_validateCTable((HUF_CElt *)prevEntropy,(uint *)workspace,local_58.LLtype);
      HVar8 = (HUF_repeat)(iVar2 != 0);
    }
    memset(nextEntropy,0,0x400);
    maxNbBits = HUF_optimalTableLog(0xb,sourceSize,local_58.LLtype);
    sVar3 = HUF_buildCTable_wksp
                      ((HUF_CElt *)nextEntropy,(uint *)workspace,local_58.LLtype,maxNbBits,
                       (void *)((long)workspace + 0x400),wkspSize - 0x400);
    if (0xffffffffffffff88 < sVar3) goto LAB_001a2661;
    sVar4 = HUF_estimateCompressedSize((HUF_CElt *)nextEntropy,(uint *)workspace,local_58.LLtype);
    sVar3 = HUF_writeCTable_wksp
                      ((entropyMetadata->hufMetadata).hufDesBuffer,0x80,(HUF_CElt *)nextEntropy,
                       local_58.LLtype,(uint)sVar3,(void *)((long)workspace + 0x400),
                       wkspSize - 0x400);
    if (((HVar8 != HUF_repeat_none) &&
        (sVar5 = HUF_estimateCompressedSize
                           ((HUF_CElt *)prevEntropy,(uint *)workspace,local_58.LLtype),
        sVar5 < sourceSize)) && (sourceSize <= sVar3 + 0xc || sVar5 <= sVar3 + sVar4)) {
      sVar9 = set_repeat;
LAB_001a2676:
      memcpy(nextEntropy,prevEntropy,0x404);
      goto LAB_001a2419;
    }
    sVar9 = set_basic;
    if (sourceSize <= sVar4 + sVar3) goto LAB_001a2676;
    (entropyMetadata->hufMetadata).hType = set_compressed;
    (nextEntropy->huf).repeatMode = HUF_repeat_check;
    (entropyMetadata->hufMetadata).hufDesSize = sVar3;
    if (0xffffffffffffff88 < sVar3) {
      return sVar3;
    }
  }
  else {
LAB_001a2419:
    (entropyMetadata->hufMetadata).hType = sVar9;
    (entropyMetadata->hufMetadata).hufDesSize = 0;
  }
  lVar7 = (long)seqStorePtr->sequences - (long)seqStorePtr->sequencesStart;
  if (lVar7 == 0) {
    (nextEntropy->fse).litlength_repeatMode = FSE_repeat_none;
    (nextEntropy->fse).offcode_repeatMode = FSE_repeat_none;
    (nextEntropy->fse).matchlength_repeatMode = FSE_repeat_none;
    uVar10 = 0;
    local_58.MLtype = set_basic;
    local_58.size = 0;
    local_58.lastCountSize = 0;
  }
  else {
    ZSTD_buildSequencesStatistics
              (&local_58,seqStorePtr,lVar7 >> 3,&prevEntropy->fse,&nextEntropy->fse,
               (entropyMetadata->fseMetadata).fseTablesBuffer,
               &(entropyMetadata->fseMetadata).field_0x91,(local_38->cParams).strategy,
               (uint *)workspace,(void *)((long)workspace + 0xd4),wkspSize - 0xd4);
    if (0xffffffffffffff88 < local_58.size) goto LAB_001a24e0;
    uVar10 = CONCAT44(local_58.Offtype,local_58.LLtype);
  }
  (entropyMetadata->fseMetadata).llType = (int)uVar10;
  (entropyMetadata->fseMetadata).ofType = (int)((ulong)uVar10 >> 0x20);
  (entropyMetadata->fseMetadata).mlType = local_58.MLtype;
  (entropyMetadata->fseMetadata).lastCountSize = local_58.lastCountSize;
LAB_001a24e0:
  (entropyMetadata->fseMetadata).fseTablesSize = local_58.size;
  uVar6 = 0;
  if (0xffffffffffffff88 < local_58.size) {
    uVar6 = local_58.size;
  }
  return uVar6;
}

Assistant:

size_t ZSTD_buildBlockEntropyStats(seqStore_t* seqStorePtr,
                             const ZSTD_entropyCTables_t* prevEntropy,
                                   ZSTD_entropyCTables_t* nextEntropy,
                             const ZSTD_CCtx_params* cctxParams,
                                   ZSTD_entropyCTablesMetadata_t* entropyMetadata,
                                   void* workspace, size_t wkspSize)
{
    size_t const litSize = seqStorePtr->lit - seqStorePtr->litStart;
    entropyMetadata->hufMetadata.hufDesSize =
        ZSTD_buildBlockEntropyStats_literals(seqStorePtr->litStart, litSize,
                                            &prevEntropy->huf, &nextEntropy->huf,
                                            &entropyMetadata->hufMetadata,
                                            ZSTD_disableLiteralsCompression(cctxParams),
                                            workspace, wkspSize);
    FORWARD_IF_ERROR(entropyMetadata->hufMetadata.hufDesSize, "ZSTD_buildBlockEntropyStats_literals failed");
    entropyMetadata->fseMetadata.fseTablesSize =
        ZSTD_buildBlockEntropyStats_sequences(seqStorePtr,
                                              &prevEntropy->fse, &nextEntropy->fse,
                                              cctxParams,
                                              &entropyMetadata->fseMetadata,
                                              workspace, wkspSize);
    FORWARD_IF_ERROR(entropyMetadata->fseMetadata.fseTablesSize, "ZSTD_buildBlockEntropyStats_sequences failed");
    return 0;
}